

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DWrapper.cpp
# Opt level: O0

uchar * __thiscall Assimp::M3DWrapper::Save(M3DWrapper *this,int quality,int flags,uint *size)

{
  uchar *puVar1;
  uint *size_local;
  int flags_local;
  int quality_local;
  M3DWrapper *this_local;
  
  ClearSave(this);
  puVar1 = m3d_save(this->m3d_,quality,flags,size);
  this->saved_output_ = puVar1;
  return this->saved_output_;
}

Assistant:

unsigned char *M3DWrapper::Save(int quality, int flags, unsigned int &size) {
#if (!(ASSIMP_BUILD_NO_EXPORT || ASSIMP_BUILD_NO_M3D_EXPORTER))
	ClearSave();
	saved_output_ = m3d_save(m3d_, quality, flags, &size);
	return saved_output_;
#else
	return nullptr;
#endif
}